

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForMessage
          (Context *this,Descriptor *message)

{
  int iVar1;
  mapped_type *pmVar2;
  long lVar3;
  long lVar4;
  OneofDescriptor *oneof;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  OneofGeneratorInfo info;
  key_type local_b0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  FieldDescriptor *local_90;
  undefined8 local_88;
  FieldDescriptor local_80 [16];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  if (0 < *(int *)(message + 0x70)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      InitializeFieldGeneratorInfoForMessage(this,(Descriptor *)(*(long *)(message + 0x38) + lVar3))
      ;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x88;
    } while (lVar4 < *(int *)(message + 0x70));
  }
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FieldDescriptor **)0x0;
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FieldDescriptor **)0x0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve(&local_a8,(long)*(int *)(message + 4));
  iVar1 = *(int *)(message + 4);
  if (0 < iVar1) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      local_90 = (FieldDescriptor *)(*(long *)(message + 0x28) + lVar4);
      if (local_a8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_a8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&local_a8,
                   (iterator)
                   local_a8.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_90);
        iVar1 = *(int *)(message + 4);
      }
      else {
        *local_a8.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_90;
        local_a8.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_a8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x48;
    } while (lVar3 < iVar1);
  }
  InitializeFieldGeneratorInfoForFields(this,&local_a8);
  if (0 < *(int *)(message + 0x68)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      local_b0 = (key_type)(*(long *)(message + 0x30) + lVar3);
      local_90 = local_80;
      local_88 = 0;
      local_80[0] = (FieldDescriptor)0x0;
      local_70 = local_60;
      local_68 = 0;
      local_60[0] = 0;
      UnderscoresToCamelCase(&local_50,*(string **)(*(long *)(message + 0x30) + 8 + lVar3),false);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      UnderscoresToCamelCase(&local_50,*(string **)(local_b0 + 8),true);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pmVar2 = std::
               map<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
               ::operator[](&this->oneof_generator_info_map_,&local_b0);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      std::__cxx11::string::_M_assign((string *)&pmVar2->capitalized_name);
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (lVar4 < *(int *)(message + 0x68));
  }
  if (local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForMessage(
    const Descriptor* message) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    InitializeFieldGeneratorInfoForMessage(message->nested_type(i));
  }
  std::vector<const FieldDescriptor*> fields;
  fields.reserve(message->field_count());
  for (int i = 0; i < message->field_count(); ++i) {
    fields.push_back(message->field(i));
  }
  InitializeFieldGeneratorInfoForFields(fields);

  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    OneofGeneratorInfo info;
    info.name = UnderscoresToCamelCase(oneof->name(), false);
    info.capitalized_name = UnderscoresToCamelCase(oneof->name(), true);
    oneof_generator_info_map_[oneof] = info;
  }
}